

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O2

void MARGINAL::save_load(data *sm,io_buf *io,bool read,bool text)

{
  vw *pvVar1;
  uint32_t *puVar2;
  ostream *poVar3;
  _Hash_node_base *p_Var4;
  size_t i;
  ulong uVar5;
  uint64_t total_size;
  float w2;
  float c2;
  float r2;
  float w1;
  double denominator;
  double numerator;
  uint64_t index;
  ulong local_1e8;
  long local_1e0;
  double local_1d8;
  undefined8 local_1d0;
  float local_1c8;
  float local_1c4;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_1c0;
  stringstream msg;
  ostream local_1a8;
  
  pvVar1 = sm->all;
  puVar2 = &(pvVar1->weights).dense_weights._stride_shift;
  if ((pvVar1->weights).sparse != false) {
    puVar2 = &(pvVar1->weights).sparse_weights._stride_shift;
  }
  if ((io->files)._end != (io->files)._begin) {
    local_1e8 = (ulong)*puVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    if (!read) {
      total_size = (sm->marginals)._M_h._M_element_count;
      poVar3 = std::operator<<(&local_1a8,"marginals size = ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,"\n");
    }
    bin_text_read_write_fixed_validated(io,(char *)&total_size,8,"",read,&msg,text);
    local_1c0 = (_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 *)&sm->marginals;
    p_Var4 = (sm->marginals)._M_h._M_before_begin._M_nxt;
    uVar5 = 0;
    while( true ) {
      if (total_size <= uVar5) break;
      if (!read) {
        index = (ulong)p_Var4[1]._M_nxt >> ((byte)local_1e8 & 0x3f);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::operator<<(poVar3,":");
      }
      bin_text_read_write_fixed(io,(char *)&index,8,"",read,&msg,text);
      if (!read) {
        numerator = (double)p_Var4[2]._M_nxt;
        poVar3 = std::ostream::_M_insert<double>(numerator);
        std::operator<<(poVar3,":");
      }
      bin_text_read_write_fixed(io,(char *)&numerator,8,"",read,&msg,text);
      if (!read) {
        denominator = (double)p_Var4[3]._M_nxt;
        poVar3 = std::ostream::_M_insert<double>(denominator);
        std::operator<<(poVar3,"\n");
      }
      bin_text_read_write_fixed(io,(char *)&denominator,8,"",read,&msg,text);
      if (read) {
        local_1e0 = index << ((byte)local_1e8 & 0x3f);
        local_1d8 = numerator;
        local_1d0 = denominator;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,std::pair<double,double>>>(local_1c0,&local_1e0);
      }
      else {
        p_Var4 = p_Var4->_M_nxt;
      }
      uVar5 = uVar5 + 1;
    }
    if (sm->compete != false) {
      if (!read) {
        total_size = (sm->expert_state)._M_h._M_element_count;
        poVar3 = std::operator<<(&local_1a8,"expert_state size = ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3,"\n");
      }
      bin_text_read_write_fixed_validated(io,(char *)&total_size,8,"",read,&msg,text);
      p_Var4 = (sm->expert_state)._M_h._M_before_begin._M_nxt;
      for (uVar5 = 0; uVar5 < total_size; uVar5 = uVar5 + 1) {
        if (!read) {
          index = (ulong)p_Var4[1]._M_nxt >> ((byte)local_1e8 & 0x3f);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::operator<<(poVar3,":");
        }
        bin_text_read_write_fixed(io,(char *)&index,8,"",read,&msg,text);
        if (!read) {
          numerator = (double)CONCAT44(numerator._4_4_,*(float *)&p_Var4[2]._M_nxt);
          denominator = (double)CONCAT44(denominator._4_4_,
                                         *(undefined4 *)((long)&p_Var4[2]._M_nxt + 4));
          w1 = *(float *)&p_Var4[3]._M_nxt;
          r2 = *(float *)((long)&p_Var4[3]._M_nxt + 4);
          c2 = *(float *)&p_Var4[4]._M_nxt;
          w2 = *(float *)((long)&p_Var4[4]._M_nxt + 4);
          poVar3 = (ostream *)std::ostream::operator<<(&local_1a8,*(float *)&p_Var4[2]._M_nxt);
          std::operator<<(poVar3,":");
        }
        bin_text_read_write_fixed(io,(char *)&numerator,4,"",read,&msg,text);
        if (!read) {
          poVar3 = (ostream *)std::ostream::operator<<(&local_1a8,denominator._0_4_);
          std::operator<<(poVar3,":");
        }
        bin_text_read_write_fixed(io,(char *)&denominator,4,"",read,&msg,text);
        if (!read) {
          poVar3 = (ostream *)std::ostream::operator<<(&local_1a8,w1);
          std::operator<<(poVar3,":");
        }
        bin_text_read_write_fixed(io,(char *)&w1,4,"",read,&msg,text);
        if (!read) {
          poVar3 = (ostream *)std::ostream::operator<<(&local_1a8,r2);
          std::operator<<(poVar3,":");
        }
        bin_text_read_write_fixed(io,(char *)&r2,4,"",read,&msg,text);
        if (!read) {
          poVar3 = (ostream *)std::ostream::operator<<(&local_1a8,c2);
          std::operator<<(poVar3,":");
        }
        bin_text_read_write_fixed(io,(char *)&c2,4,"",read,&msg,text);
        if (!read) {
          poVar3 = (ostream *)std::ostream::operator<<(&local_1a8,w2);
          std::operator<<(poVar3,":");
        }
        bin_text_read_write_fixed(io,(char *)&w2,4,"",read,&msg,text);
        if (read) {
          local_1e0 = index << ((byte)local_1e8 & 0x3f);
          local_1d8 = (double)CONCAT44(denominator._0_4_,SUB84(numerator,0));
          local_1d0 = (double)CONCAT44(r2,w1);
          local_1c8 = c2;
          local_1c4 = w2;
          std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_long,std::pair<MARGINAL::expert,MARGINAL::expert>>>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&sm->expert_state,&local_1e0);
        }
        else {
          p_Var4 = p_Var4->_M_nxt;
        }
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  }
  return;
}

Assistant:

void save_load(data& sm, io_buf& io, bool read, bool text)
{
  uint64_t stride_shift = sm.all->weights.stride_shift();

  if (io.files.size() == 0)
    return;
  stringstream msg;
  uint64_t total_size;
  if (!read)
  {
    total_size = (uint64_t)sm.marginals.size();
    msg << "marginals size = " << total_size << "\n";
  }
  bin_text_read_write_fixed_validated(io, (char*)&total_size, sizeof(total_size), "", read, msg, text);

  auto iter = sm.marginals.begin();
  for (size_t i = 0; i < total_size; ++i)
  {
    uint64_t index;
    if (!read)
    {
      index = iter->first >> stride_shift;
      msg << index << ":";
    }
    bin_text_read_write_fixed(io, (char*)&index, sizeof(index), "", read, msg, text);
    double numerator;
    if (!read)
    {
      numerator = iter->second.first;
      msg << numerator << ":";
    }
    bin_text_read_write_fixed(io, (char*)&numerator, sizeof(numerator), "", read, msg, text);
    double denominator;
    if (!read)
    {
      denominator = iter->second.second;
      msg << denominator << "\n";
    }
    bin_text_read_write_fixed(io, (char*)&denominator, sizeof(denominator), "", read, msg, text);
    if (read)
      sm.marginals.insert(make_pair(index << stride_shift, make_pair(numerator, denominator)));
    else
      ++iter;
  }

  if (sm.compete)
  {
    if (!read)
    {
      total_size = (uint64_t)sm.expert_state.size();
      msg << "expert_state size = " << total_size << "\n";
    }
    bin_text_read_write_fixed_validated(io, (char*)&total_size, sizeof(total_size), "", read, msg, text);

    auto exp_iter = sm.expert_state.begin();
    for (size_t i = 0; i < total_size; ++i)
    {
      uint64_t index;
      if (!read)
      {
        index = exp_iter->first >> stride_shift;
        msg << index << ":";
      }
      bin_text_read_write_fixed(io, (char*)&index, sizeof(index), "", read, msg, text);
      float r1, c1, w1, r2, c2, w2;
      if (!read)
      {
        r1 = exp_iter->second.first.regret;
        c1 = exp_iter->second.first.abs_regret;
        w1 = exp_iter->second.first.weight;
        r2 = exp_iter->second.second.regret;
        c2 = exp_iter->second.second.abs_regret;
        w2 = exp_iter->second.second.weight;
        msg << r1 << ":";
      }
      bin_text_read_write_fixed(io, (char*)&r1, sizeof(r1), "", read, msg, text);
      if (!read)
        msg << c1 << ":";
      bin_text_read_write_fixed(io, (char*)&c1, sizeof(c1), "", read, msg, text);
      if (!read)
        msg << w1 << ":";
      bin_text_read_write_fixed(io, (char*)&w1, sizeof(w1), "", read, msg, text);
      if (!read)
        msg << r2 << ":";
      bin_text_read_write_fixed(io, (char*)&r2, sizeof(r2), "", read, msg, text);
      if (!read)
        msg << c2 << ":";
      bin_text_read_write_fixed(io, (char*)&c2, sizeof(c2), "", read, msg, text);
      if (!read)
        msg << w2 << ":";
      bin_text_read_write_fixed(io, (char*)&w2, sizeof(w2), "", read, msg, text);

      if (read)
      {
        expert e1 = {r1, c1, w1};
        expert e2 = {r2, c2, w2};
        sm.expert_state.insert(make_pair(index << stride_shift, make_pair(e1, e2)));
      }
      else
        ++exp_iter;
    }
  }
}